

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

void bam_plp_reset(bam_plp_t iter)

{
  int iVar1;
  __linkbuf_t *p_Var2;
  __linkbuf_t *p_Var3;
  mempool_t *pmVar4;
  lbnode_t *plVar5;
  lbnode_t **pplVar6;
  int iVar7;
  
  iter->max_pos = -1;
  iter->is_eof = 0;
  iter->max_tid = -1;
  iter->tid = 0;
  iter->pos = 0;
  p_Var2 = iter->head->next;
  plVar5 = iter->head;
  while (p_Var2 != (__linkbuf_t *)0x0) {
    overlap_remove(iter,(bam1_t *)0x0);
    p_Var3 = plVar5->next;
    pmVar4 = iter->mp;
    pmVar4->cnt = pmVar4->cnt + -1;
    plVar5->next = (__linkbuf_t *)0x0;
    iVar1 = pmVar4->max;
    if (pmVar4->n == iVar1) {
      iVar7 = iVar1 * 2;
      if (iVar1 == 0) {
        iVar7 = 0x100;
      }
      pmVar4->max = iVar7;
      pplVar6 = (lbnode_t **)realloc(pmVar4->buf,(long)iVar7 << 3);
      pmVar4->buf = pplVar6;
    }
    iVar1 = pmVar4->n;
    pmVar4->n = iVar1 + 1;
    pmVar4->buf[iVar1] = plVar5;
    plVar5 = p_Var3;
    p_Var2 = p_Var3->next;
  }
  iter->head = iter->tail;
  return;
}

Assistant:

void bam_plp_reset(bam_plp_t iter)
{
    lbnode_t *p, *q;
    iter->max_tid = iter->max_pos = -1;
    iter->tid = iter->pos = 0;
    iter->is_eof = 0;
    for (p = iter->head; p->next;) {
        overlap_remove(iter, NULL);
        q = p->next;
        mp_free(iter->mp, p);
        p = q;
    }
    iter->head = iter->tail;
}